

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_simd(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m256i row;
  __m256i row_00;
  __m256i row_01;
  __m256i col;
  __m256i col_00;
  __m256i col_01;
  __m256i scale;
  __m256i scale_00;
  __m256i scale_01;
  int i;
  int iVar9;
  float *pfVar10;
  int iVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  int l;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  uint uVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  int l_count;
  long lVar25;
  int k_count;
  long lVar26;
  float *pfVar27;
  float *pfVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  longlong lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 in_ZMM7 [64];
  float fVar57;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  float fVar58;
  float fVar59;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  float fVar60;
  undefined4 in_stack_fffffffffffffeec;
  float fVar61;
  undefined4 in_stack_fffffffffffffef0;
  float fVar62;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  float fVar63;
  undefined4 uVar64;
  float fVar65;
  undefined4 uVar66;
  longlong lVar67;
  longlong lVar68;
  
  fVar44 = ipoint->scale;
  auVar39._4_4_ = fVar44;
  auVar39._0_4_ = fVar44;
  auVar39._8_4_ = fVar44;
  auVar39._12_4_ = fVar44;
  auVar30._8_4_ = 0x7fffffff;
  auVar30._0_8_ = 0x7fffffff7fffffff;
  auVar30._12_4_ = 0x7fffffff;
  fVar41 = -0.08 / (fVar44 * fVar44);
  auVar29 = vpternlogd_avx512vl(auVar30,SUB6416(ZEXT464(0x3effffff),0),ZEXT416((uint)ipoint->y),0xca
                               );
  auVar30 = vpternlogd_avx512vl(auVar30,SUB6416(ZEXT464(0x3effffff),0),ZEXT416((uint)ipoint->x),0xca
                               );
  auVar35._8_4_ = 0x3effffff;
  auVar35._0_8_ = 0x3effffff3effffff;
  auVar35._12_4_ = 0x3effffff;
  auVar30 = ZEXT416((uint)(ipoint->x + auVar30._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar31._0_8_ = (double)auVar30._0_4_;
  auVar31._8_8_ = auVar30._8_8_;
  auVar38._0_8_ = (double)fVar44;
  auVar38._8_8_ = auVar39._8_8_;
  auVar30 = vfmadd231sd_fma(auVar31,auVar38,ZEXT816(0x3fe0000000000000));
  auVar34._0_4_ = (float)auVar30._0_8_;
  auVar34._4_12_ = auVar30._4_12_;
  auVar36._8_4_ = 0x80000000;
  auVar36._0_8_ = 0x8000000080000000;
  auVar36._12_4_ = 0x80000000;
  auVar30 = ZEXT416((uint)(ipoint->y + auVar29._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar29._0_8_ = (double)auVar30._0_4_;
  auVar29._8_8_ = auVar30._8_8_;
  auVar30 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar39,auVar34);
  auVar29 = vfmadd231sd_fma(auVar29,auVar38,ZEXT816(0x3fe0000000000000));
  auVar30 = vinsertps_avx(auVar30,auVar39,0x10);
  auVar31 = vpternlogd_avx512vl(auVar36,auVar30,auVar35,0xea);
  auVar33._0_4_ = (float)auVar29._0_8_;
  auVar33._4_12_ = auVar29._4_12_;
  auVar32._0_4_ = auVar30._0_4_ + auVar31._0_4_;
  auVar32._4_4_ = auVar30._4_4_ + auVar31._4_4_;
  auVar32._8_4_ = auVar30._8_4_ + auVar31._8_4_;
  auVar32._12_4_ = auVar30._12_4_ + auVar31._12_4_;
  auVar30 = vroundps_avx(auVar32,0xb);
  auVar37._0_4_ = (int)auVar30._0_4_;
  auVar37._4_4_ = (int)auVar30._4_4_;
  auVar37._8_4_ = (int)auVar30._8_4_;
  auVar37._12_4_ = (int)auVar30._12_4_;
  auVar29 = vpshufd_avx(auVar37,0x55);
  auVar30 = vcvtdq2ps_avx(auVar29);
  fVar58 = auVar33._0_4_ - auVar30._0_4_;
  if (auVar37._4_4_ < auVar37._0_4_) {
    auVar40._8_4_ = 0x80000000;
    auVar40._0_8_ = 0x8000000080000000;
    auVar40._12_4_ = 0x80000000;
    auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar39,auVar33);
    auVar32 = vpternlogd_avx512vl(auVar40,auVar31,auVar35,0xea);
    auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
    auVar31 = vroundss_avx(auVar31,auVar31,0xb);
    if (auVar37._4_4_ < (int)auVar31._0_4_) {
      auVar31 = vfmadd231ss_fma(auVar34,auVar39,ZEXT416(0x41300000));
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar32 = vpternlogd_avx512vl(auVar56,auVar31,auVar35,0xea);
      auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
      auVar31 = vroundss_avx(auVar31,auVar31,0xb);
      if ((int)auVar31._0_4_ + auVar37._4_4_ <= iimage->width) {
        auVar31 = vfmadd231ss_fma(auVar33,auVar39,ZEXT416(0x41300000));
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar33 = vpternlogd_avx512vl(auVar35,auVar31,auVar7,0xf8);
        auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar33._0_4_));
        auVar31 = vroundss_avx(auVar31,auVar31,0xb);
        if ((int)auVar31._0_4_ + auVar37._4_4_ <= iimage->height) {
          lVar50 = auVar29._0_8_;
          uVar64 = auVar29._0_4_;
          uVar66 = auVar29._4_4_;
          fVar58 = fVar58 + 0.5;
          iVar9 = -0xc;
          lVar67 = lVar50;
          lVar68 = lVar50;
          for (lVar16 = 0x40; lVar16 != 0x940; lVar16 = lVar16 + 0x60) {
            auVar47._0_4_ = (float)iVar9;
            auVar47._4_12_ = in_ZMM7._4_12_;
            vfmadd213ss_fma(auVar47,auVar39,ZEXT416((uint)fVar58));
            vpbroadcastd_avx512vl();
            row[1]._0_4_ = fVar41;
            row[0] = in_stack_fffffffffffffec8;
            row[1]._4_4_ = in_stack_fffffffffffffed4;
            row[2]._0_4_ = in_stack_fffffffffffffed8;
            row[2]._4_4_ = fVar58;
            row[3]._0_4_ = in_stack_fffffffffffffee0;
            row[3]._4_4_ = in_stack_fffffffffffffee4;
            col[0]._4_4_ = in_stack_fffffffffffffeec;
            col[0]._0_4_ = in_stack_fffffffffffffee8;
            col[1]._0_4_ = in_stack_fffffffffffffef0;
            col[1]._4_4_ = in_stack_fffffffffffffef4;
            col[2]._0_4_ = in_stack_fffffffffffffef8;
            col[2]._4_4_ = in_stack_fffffffffffffefc;
            col[3] = (longlong)ipoint;
            scale[0]._4_4_ = uVar66;
            scale[0]._0_4_ = uVar64;
            scale[1] = lVar50;
            scale[2] = lVar67;
            scale[3] = lVar68;
            haarXY_unconditional_vectorized
                      (iimage,row,col,scale,(float *)((long)haarResponseX + lVar16 + -0x40),
                       (float *)((long)haarResponseY + lVar16 + -0x40));
            row_00[1]._0_4_ = fVar41;
            row_00[0] = in_stack_fffffffffffffec8;
            row_00[1]._4_4_ = in_stack_fffffffffffffed4;
            row_00[2]._0_4_ = in_stack_fffffffffffffed8;
            row_00[2]._4_4_ = fVar58;
            row_00[3]._0_4_ = in_stack_fffffffffffffee0;
            row_00[3]._4_4_ = in_stack_fffffffffffffee4;
            col_00[0]._4_4_ = in_stack_fffffffffffffeec;
            col_00[0]._0_4_ = in_stack_fffffffffffffee8;
            col_00[1]._0_4_ = in_stack_fffffffffffffef0;
            col_00[1]._4_4_ = in_stack_fffffffffffffef4;
            col_00[2]._0_4_ = in_stack_fffffffffffffef8;
            col_00[2]._4_4_ = in_stack_fffffffffffffefc;
            col_00[3] = (longlong)ipoint;
            scale_00[0]._4_4_ = uVar66;
            scale_00[0]._0_4_ = uVar64;
            scale_00[1] = lVar50;
            scale_00[2] = lVar67;
            scale_00[3] = lVar68;
            haarXY_unconditional_vectorized
                      (iimage,row_00,col_00,scale_00,(float *)((long)haarResponseX + lVar16 + -0x20)
                       ,(float *)((long)haarResponseY + lVar16 + -0x20));
            row_01[1]._0_4_ = fVar41;
            row_01[0] = in_stack_fffffffffffffec8;
            row_01[1]._4_4_ = in_stack_fffffffffffffed4;
            row_01[2]._0_4_ = in_stack_fffffffffffffed8;
            row_01[2]._4_4_ = fVar58;
            row_01[3]._0_4_ = in_stack_fffffffffffffee0;
            row_01[3]._4_4_ = in_stack_fffffffffffffee4;
            col_01[0]._4_4_ = in_stack_fffffffffffffeec;
            col_01[0]._0_4_ = in_stack_fffffffffffffee8;
            col_01[1]._0_4_ = in_stack_fffffffffffffef0;
            col_01[1]._4_4_ = in_stack_fffffffffffffef4;
            col_01[2]._0_4_ = in_stack_fffffffffffffef8;
            col_01[2]._4_4_ = in_stack_fffffffffffffefc;
            col_01[3] = (longlong)ipoint;
            scale_01[0]._4_4_ = uVar66;
            scale_01[0]._0_4_ = uVar64;
            scale_01[1] = lVar50;
            scale_01[2] = lVar67;
            scale_01[3] = lVar68;
            haarXY_unconditional_vectorized
                      (iimage,row_01,col_01,scale_01,(float *)((long)haarResponseX + lVar16),
                       (float *)((long)haarResponseY + lVar16));
            iVar9 = iVar9 + 1;
          }
          goto LAB_00151d85;
        }
      }
    }
  }
  iVar9 = -0xc;
  lVar16 = 0;
  for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 1) {
    auVar45._0_4_ = (float)iVar9;
    auVar45._4_12_ = in_ZMM7._4_12_;
    auVar29 = vfmadd213ss_fma(auVar45,auVar39,ZEXT416((uint)fVar58));
    fVar42 = auVar29._0_4_;
    lVar15 = lVar16;
    for (lVar26 = 0; lVar26 != 0x18; lVar26 = lVar26 + 1) {
      auVar46._0_4_ = (float)((int)lVar26 + -0xc);
      auVar46._4_12_ = in_ZMM7._4_12_;
      auVar29 = vfmadd132ss_fma(auVar46,ZEXT416((uint)(auVar34._0_4_ - auVar30._0_4_)),
                                ZEXT416((uint)fVar44));
      fVar43 = auVar29._0_4_;
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar42) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar42) * -0x4020000000000000) + (double)fVar42)
                 ,(int)((double)((ulong)(0.0 <= fVar43) * 0x3fe0000000000000 +
                                (ulong)(0.0 > fVar43) * -0x4020000000000000) + (double)fVar43),
                 auVar37._4_4_,(float *)((long)haarResponseX + lVar15),
                 (float *)((long)haarResponseY + lVar15));
      lVar15 = lVar15 + 4;
    }
    iVar9 = iVar9 + 1;
    lVar16 = lVar16 + 0x60;
  }
LAB_00151d85:
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  auVar30 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 0.5)),auVar48,0xf8);
  auVar30 = ZEXT416((uint)(fVar44 * 0.5 + auVar30._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar29 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 1.5)),auVar48,0xf8);
  auVar29 = ZEXT416((uint)(fVar44 * 1.5 + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar31 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 2.5)),auVar48,0xf8);
  auVar31 = ZEXT416((uint)(fVar44 * 2.5 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  auVar33 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 3.5)),auVar48,0xf8);
  auVar33 = ZEXT416((uint)(fVar44 * 3.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar32 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 4.5)),auVar48,0xf8);
  auVar32 = ZEXT416((uint)(fVar44 * 4.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar34 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 5.5)),auVar48,0xf8);
  auVar34 = ZEXT416((uint)(auVar34._0_4_ + fVar44 * 5.5));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 6.5)),auVar48,0xf8);
  auVar35 = ZEXT416((uint)(fVar44 * 6.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 7.5)),auVar48,0xf8);
  auVar36 = ZEXT416((uint)(fVar44 * 7.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 8.5)),auVar48,0xf8);
  auVar37 = ZEXT416((uint)(fVar44 * 8.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 9.5)),auVar48,0xf8);
  auVar38 = ZEXT416((uint)(fVar44 * 9.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 10.5)),auVar48,0xf8);
  auVar39 = ZEXT416((uint)(fVar44 * 10.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar44 * 11.5)),auVar48,0xf8);
  fVar55 = auVar31._0_4_;
  fVar58 = fVar55 + auVar30._0_4_;
  fVar42 = fVar55 + auVar29._0_4_;
  fVar43 = fVar55 - auVar30._0_4_;
  fVar60 = fVar55 - auVar29._0_4_;
  fVar61 = fVar55 - auVar33._0_4_;
  auVar30 = ZEXT416((uint)(fVar44 * 11.5 + auVar40._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  fVar44 = fVar55 - auVar34._0_4_;
  fVar57 = auVar36._0_4_;
  fVar3 = fVar57 - auVar30._0_4_;
  fVar62 = fVar55 - auVar32._0_4_;
  fVar63 = fVar57 - auVar33._0_4_;
  fVar55 = fVar55 - auVar35._0_4_;
  fVar4 = fVar57 - auVar32._0_4_;
  fVar59 = fVar57 - auVar34._0_4_;
  fVar5 = fVar57 - auVar35._0_4_;
  fVar6 = fVar57 - auVar37._0_4_;
  fVar65 = fVar57 - auVar38._0_4_;
  fVar57 = fVar57 - auVar39._0_4_;
  gauss_s1_c0[0] = expf(fVar42 * fVar42 * fVar41);
  gauss_s1_c0[1] = expf(fVar58 * fVar58 * fVar41);
  gauss_s1_c0[2] = expf(fVar43 * fVar43 * fVar41);
  gauss_s1_c0[3] = expf(fVar60 * fVar60 * fVar41);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar61 * fVar61 * fVar41);
  gauss_s1_c0[6] = expf(fVar62 * fVar62 * fVar41);
  gauss_s1_c0[7] = expf(fVar44 * fVar44 * fVar41);
  gauss_s1_c0[8] = expf(fVar55 * fVar55 * fVar41);
  gauss_s1_c1[0] = expf(fVar63 * fVar63 * fVar41);
  gauss_s1_c1[1] = expf(fVar4 * fVar4 * fVar41);
  gauss_s1_c1[2] = expf(fVar59 * fVar59 * fVar41);
  gauss_s1_c1[3] = expf(fVar5 * fVar5 * fVar41);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar6 * fVar6 * fVar41);
  gauss_s1_c1[6] = expf(fVar65 * fVar65 * fVar41);
  gauss_s1_c1[7] = expf(fVar57 * fVar57 * fVar41);
  gauss_s1_c1[8] = expf(fVar3 * fVar3 * fVar41);
  auVar49 = ZEXT1264(ZEXT812(0));
  iVar9 = 0;
  auVar52._8_4_ = 0x7fffffff;
  auVar52._0_8_ = 0x7fffffff7fffffff;
  auVar52._12_4_ = 0x7fffffff;
  lVar16 = 0;
  uVar23 = 0xfffffffffffffff8;
  pfVar12 = haarResponseY;
  pfVar19 = haarResponseX;
  while (uVar21 = (uint)uVar23, (int)uVar21 < 8) {
    pfVar27 = gauss_s1_c0;
    lVar25 = (long)iVar9;
    lVar16 = (long)(int)lVar16;
    if (uVar21 == 7) {
      pfVar27 = gauss_s1_c1;
    }
    if (uVar21 == 0xfffffff8) {
      pfVar27 = gauss_s1_c1;
    }
    uVar17 = 0;
    iVar9 = iVar9 + 4;
    uVar24 = 0xfffffffffffffff8;
    pfVar13 = pfVar12;
    pfVar20 = pfVar19;
    while (lVar25 != iVar9) {
      iVar11 = (int)uVar24;
      pfVar22 = gauss_s1_c0;
      auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = (ulong)((uint)(uVar24 >> 0x1c) & 8);
      if (iVar11 == 7) {
        pfVar22 = gauss_s1_c1;
      }
      if (iVar11 == -8) {
        pfVar22 = gauss_s1_c1;
      }
      pfVar10 = pfVar20;
      pfVar14 = pfVar13;
      for (uVar18 = uVar17; uVar18 < iVar11 * 0x18 + 0x198; uVar18 = uVar18 + 0x18) {
        lVar15 = 0;
        pfVar28 = (float *)((long)pfVar27 + (ulong)(((uint)(uVar23 >> 0x1f) & 1) << 5));
        while (lVar15 != 9) {
          fVar44 = *pfVar28;
          pfVar28 = pfVar28 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          pfVar1 = pfVar14 + lVar15;
          pfVar2 = pfVar10 + lVar15;
          lVar15 = lVar15 + 1;
          auVar31 = ZEXT416((uint)(pfVar22[uVar24] * fVar44 * *pfVar2));
          auVar30 = vandps_avx(auVar31,auVar52);
          auVar33 = ZEXT416((uint)(pfVar22[uVar24] * fVar44 * *pfVar1));
          auVar29 = vandps_avx(auVar33,auVar52);
          auVar31 = vinsertps_avx(auVar33,auVar31,0x10);
          auVar29 = vmovlhps_avx(auVar31,auVar29);
          auVar30 = vinsertps_avx(auVar29,auVar30,0x30);
          auVar53 = ZEXT1664(CONCAT412(auVar53._12_4_ + auVar30._12_4_,
                                       CONCAT48(auVar53._8_4_ + auVar30._8_4_,
                                                CONCAT44(auVar53._4_4_ + auVar30._4_4_,
                                                         auVar53._0_4_ + auVar30._0_4_))));
        }
        uVar24 = uVar24 + (ulong)(-1 < iVar11) * 2 + -1;
        pfVar10 = pfVar10 + 0x18;
        pfVar14 = pfVar14 + 0x18;
      }
      uVar24 = (ulong)(iVar11 + 5);
      uVar17 = uVar17 + 0x78;
      fVar44 = gauss_s2_arr[lVar25];
      auVar8._4_4_ = fVar44;
      auVar8._0_4_ = fVar44;
      auVar8._8_4_ = fVar44;
      auVar8._12_4_ = fVar44;
      auVar33 = vmulps_avx512vl(auVar53._0_16_,auVar8);
      lVar25 = lVar25 + 1;
      auVar54._0_4_ = auVar33._0_4_ * auVar33._0_4_;
      auVar54._4_4_ = auVar33._4_4_ * auVar33._4_4_;
      auVar54._8_4_ = auVar33._8_4_ * auVar33._8_4_;
      auVar54._12_4_ = auVar33._12_4_ * auVar33._12_4_;
      auVar29 = vshufpd_avx(auVar33,auVar33,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar16) = auVar33;
      lVar16 = lVar16 + 4;
      pfVar20 = pfVar20 + 0x78;
      pfVar13 = pfVar13 + 0x78;
      auVar30 = vmovshdup_avx(auVar54);
      auVar31 = vfmadd231ss_fma(auVar30,auVar33,auVar33);
      auVar30 = vshufps_avx(auVar33,auVar33,0xff);
      auVar29 = vfmadd213ss_fma(auVar29,auVar29,auVar31);
      auVar30 = vfmadd213ss_fma(auVar30,auVar30,auVar29);
      auVar49 = ZEXT464((uint)(auVar49._0_4_ + auVar30._0_4_));
    }
    pfVar19 = pfVar19 + 5;
    pfVar12 = pfVar12 + 5;
    uVar23 = (ulong)(uVar21 + 5);
  }
  if (auVar49._0_4_ < 0.0) {
    fVar44 = sqrtf(auVar49._0_4_);
  }
  else {
    auVar30 = vsqrtss_avx(auVar49._0_16_,auVar49._0_16_);
    fVar44 = auVar30._0_4_;
  }
  for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
    ipoint->descriptor[lVar16] = (1.0 / fVar44) * ipoint->descriptor[lVar16];
  }
  return;
}

Assistant:

void get_msurf_descriptor_simd(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            __m256i sample_y_sub_int_scale_vec = _mm256_set1_epi32(sample_y_sub_int_scale);

            __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
            __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
            __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

            __m256 ipoint_x_sub_int_scale_add_05_vec = _mm256_set1_ps(ipoint_x_sub_int_scale_add_05);

            // USE CVTTPS_EPI32 FOR TRUNCATION!!!
            __m256i sample_col0 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks0));
            __m256i sample_col1 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks1));
            __m256i sample_col2 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks2));
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col0, int_scale_vec, 
                                            &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col1, int_scale_vec, 
                                            &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col2, int_scale_vec, 
                                            &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}